

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeSet::span(UnicodeSet *this,UChar *s,int32_t length,USetSpanCondition spanCondition)

{
  UBool UVar1;
  UChar *pUVar2;
  uint32_t uVar3;
  uint32_t local_164;
  uint32_t uStack_160;
  uint16_t __c2;
  int32_t prev;
  int32_t start;
  UChar32 c;
  undefined1 local_148 [8];
  UnicodeSetStringSpan strSpan;
  USetSpanCondition local_28;
  uint32_t which;
  USetSpanCondition spanCondition_local;
  int32_t length_local;
  UChar *s_local;
  UnicodeSet *this_local;
  
  if ((length < 1) || (this->bmpSet == (BMPSet *)0x0)) {
    which = length;
    if (length < 0) {
      which = u_strlen_63(s);
    }
    if (which == 0) {
      this_local._4_4_ = 0;
    }
    else if (this->stringSpan == (UnicodeSetStringSpan *)0x0) {
      UVar1 = UVector::isEmpty(this->strings);
      if (UVar1 == '\0') {
        strSpan.staticLengths[0x1f] = 0x2a - (spanCondition == USET_SPAN_NOT_CONTAINED);
        UnicodeSetStringSpan::UnicodeSetStringSpan
                  ((UnicodeSetStringSpan *)local_148,this,this->strings,strSpan.staticLengths[0x1f])
        ;
        UVar1 = UnicodeSetStringSpan::needsStringSpanUTF16((UnicodeSetStringSpan *)local_148);
        if (UVar1 != '\0') {
          this_local._4_4_ =
               UnicodeSetStringSpan::span((UnicodeSetStringSpan *)local_148,s,which,spanCondition);
        }
        UnicodeSetStringSpan::~UnicodeSetStringSpan((UnicodeSetStringSpan *)local_148);
        if (UVar1 != '\0') {
          return this_local._4_4_;
        }
      }
      local_28 = spanCondition;
      if (spanCondition != USET_SPAN_NOT_CONTAINED) {
        local_28 = USET_SPAN_CONTAINED;
      }
      uStack_160 = 0;
      do {
        local_164 = uStack_160;
        uVar3 = uStack_160 + 1;
        prev = (int32_t)(ushort)s[(int)uStack_160];
        if ((((prev & 0xfffffc00U) == 0xd800) && (uVar3 != which)) &&
           ((s[(int)uVar3] & 0xfc00U) == 0xdc00)) {
          prev = prev * 0x400 + (uint)(ushort)s[(int)uVar3] + -0x35fdc00;
          uVar3 = uStack_160 + 2;
        }
        uStack_160 = uVar3;
        UVar1 = contains(this,prev);
      } while ((local_28 == (int)UVar1) && (local_164 = uStack_160, (int)uStack_160 < (int)which));
      this_local._4_4_ = local_164;
    }
    else {
      this_local._4_4_ = UnicodeSetStringSpan::span(this->stringSpan,s,which,spanCondition);
    }
  }
  else {
    pUVar2 = BMPSet::span(this->bmpSet,s,s + length,spanCondition);
    this_local._4_4_ = (uint32_t)((long)pUVar2 - (long)s >> 1);
  }
  return this_local._4_4_;
}

Assistant:

int32_t UnicodeSet::span(const UChar *s, int32_t length, USetSpanCondition spanCondition) const {
    if(length>0 && bmpSet!=NULL) {
        return (int32_t)(bmpSet->span(s, s+length, spanCondition)-s);
    }
    if(length<0) {
        length=u_strlen(s);
    }
    if(length==0) {
        return 0;
    }
    if(stringSpan!=NULL) {
        return stringSpan->span(s, length, spanCondition);
    } else if(!strings->isEmpty()) {
        uint32_t which= spanCondition==USET_SPAN_NOT_CONTAINED ?
                            UnicodeSetStringSpan::FWD_UTF16_NOT_CONTAINED :
                            UnicodeSetStringSpan::FWD_UTF16_CONTAINED;
        UnicodeSetStringSpan strSpan(*this, *strings, which);
        if(strSpan.needsStringSpanUTF16()) {
            return strSpan.span(s, length, spanCondition);
        }
    }

    if(spanCondition!=USET_SPAN_NOT_CONTAINED) {
        spanCondition=USET_SPAN_CONTAINED;  // Pin to 0/1 values.
    }

    UChar32 c;
    int32_t start=0, prev=0;
    do {
        U16_NEXT(s, start, length, c);
        if(spanCondition!=contains(c)) {
            break;
        }
    } while((prev=start)<length);
    return prev;
}